

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O1

_Fact * __thiscall r_exec::_Fact::get_absentee(_Fact *this)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  _Fact *this_01;
  undefined4 extraout_var_00;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined4 extraout_var_01;
  size_t s;
  Fact *this_00;
  
  s = 0;
  iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])();
  this_00 = (Fact *)CONCAT44(extraout_var,iVar2);
  sVar1 = r_code::Atom::asOpcode();
  if (sVar1 == Opcodes::Fact) {
    this_01 = (_Fact *)AntiFact::operator_new((AntiFact *)this_00,s);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar3 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)this,2);
    uVar4 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)this,3);
    AntiFact::AntiFact((AntiFact *)this_01,(Code *)CONCAT44(extraout_var_00,iVar2),uVar3,uVar4,1.0,
                       1.0);
  }
  else {
    this_01 = (_Fact *)Fact::operator_new(this_00,s);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar3 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)this,2);
    uVar4 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)this,3);
    Fact::Fact((Fact *)this_01,(Code *)CONCAT44(extraout_var_01,iVar2),uVar3,uVar4,1.0,1.0);
  }
  return this_01;
}

Assistant:

_Fact *_Fact::get_absentee() const
{
    _Fact *absentee;

    if (is_fact()) {
        absentee = new AntiFact(get_reference(0), get_after(), get_before(), 1, 1);
    } else {
        absentee = new Fact(get_reference(0), get_after(), get_before(), 1, 1);
    }

    return absentee;
}